

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O3

void Corrade::Utility::Implementation::flipSecondToLastDimensionInPlace
               (StridedArrayView4D<char> *view)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ErasedType *pEVar3;
  long lVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  unsigned_long uVar11;
  ostream *output;
  long lVar12;
  unsigned_long uVar13;
  unsigned_long uVar14;
  ulong uVar15;
  long lVar16;
  void *__src;
  long lVar17;
  ulong uVar18;
  char tmp [32];
  unsigned_long local_b8;
  Error local_80 [2];
  
  if ((view->_stride)._data[3] == 1) {
    uVar13 = (view->_size)._data[0];
    if (uVar13 != 0) {
      pEVar3 = view->_data;
      uVar11 = (view->_size)._data[1];
      local_b8 = 0;
      uVar14 = uVar11;
      do {
        if (uVar14 == 0) {
          uVar14 = 0;
        }
        else {
          lVar4 = (view->_stride)._data[0];
          uVar13 = 0;
          do {
            uVar5 = (view->_size)._data[2];
            if (1 < uVar5) {
              lVar9 = (long)pEVar3 + (view->_stride)._data[1] * uVar13 + lVar4 * local_b8;
              lVar17 = -1;
              uVar15 = 0;
              do {
                uVar11 = (view->_size)._data[2];
                lVar10 = (view->_stride)._data[2];
                lVar16 = lVar10 * uVar15;
                uVar18 = (view->_size)._data[3];
                lVar12 = lVar9;
                if (uVar18 < 0x20) {
                  __src = (void *)((uVar11 + ~uVar15) * lVar10 + lVar9);
                }
                else {
                  uVar18 = uVar18 >> 5;
                  lVar10 = lVar10 * (uVar11 + lVar17);
                  do {
                    local_80[0].super_Debug._output = *(ostream **)(lVar12 + lVar16);
                    local_80[0].super_Debug._8_8_ = ((undefined8 *)(lVar12 + lVar16))[1];
                    puVar1 = (undefined8 *)(lVar12 + lVar16 + 0x10);
                    local_80[0].super_Debug._sourceLocationFile = (char *)*puVar1;
                    local_80[0].super_Debug._previousGlobalOutput = (ostream *)puVar1[1];
                    uVar6 = *(undefined8 *)(lVar12 + lVar10);
                    uVar7 = ((undefined8 *)(lVar12 + lVar10))[1];
                    puVar1 = (undefined8 *)(lVar12 + lVar10 + 0x10);
                    uVar8 = puVar1[1];
                    puVar2 = (undefined8 *)(lVar12 + lVar16 + 0x10);
                    *puVar2 = *puVar1;
                    puVar2[1] = uVar8;
                    *(undefined8 *)(lVar12 + lVar16) = uVar6;
                    ((undefined8 *)(lVar12 + lVar16))[1] = uVar7;
                    puVar1 = (undefined8 *)(lVar12 + lVar10 + 0x10);
                    *puVar1 = local_80[0].super_Debug._sourceLocationFile;
                    puVar1[1] = local_80[0].super_Debug._previousGlobalOutput;
                    *(undefined8 *)(lVar12 + lVar10) = local_80[0].super_Debug._output;
                    ((undefined8 *)(lVar12 + lVar10))[1] = local_80[0].super_Debug._8_8_;
                    lVar12 = lVar12 + 0x20;
                    uVar18 = uVar18 - 1;
                  } while (uVar18 != 0);
                  uVar18 = (view->_size)._data[3];
                  __src = (void *)(lVar10 + lVar12);
                }
                uVar18 = (ulong)((uint)uVar18 & 0x1f);
                memcpy(local_80,(void *)(lVar16 + lVar12),uVar18);
                memcpy((void *)(lVar16 + lVar12),__src,uVar18);
                memcpy(__src,local_80,uVar18);
                uVar15 = uVar15 + 1;
                lVar17 = lVar17 + -1;
              } while (uVar15 != uVar5 >> 1);
              uVar11 = (view->_size)._data[1];
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar11);
          uVar13 = (view->_size)._data[0];
          uVar14 = uVar11;
        }
        local_b8 = local_b8 + 1;
      } while (local_b8 != uVar13);
    }
    return;
  }
  output = Error::defaultOutput();
  Error::Error(local_80,output,(Flags)0x0);
  Debug::operator<<(&local_80[0].super_Debug,
                    "Assertion view.isContiguous<3>() failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Algorithms.cpp:232"
                   );
  Error::~Error(local_80);
  abort();
}

Assistant:

void flipSecondToLastDimensionInPlace(const Containers::StridedArrayView4D<char>& view) {
    /* Should have been checked by flipInPlace() already, just verifying that
       all the bubbling back to four dimensions went correct */
    CORRADE_INTERNAL_ASSERT(view.isContiguous<3>());

    auto* const ptr = static_cast<char*>(view.data());
    const std::size_t* size = view.size().begin();
    const std::ptrdiff_t* stride = view.stride().begin();

    for(std::size_t i0 = 0; i0 != size[0]; ++i0) {
        char* const ptr0 = ptr + i0*stride[0];
        for(std::size_t i1 = 0; i1 != size[1]; ++i1) {
            char* const ptr1 = ptr0 + i1*stride[1];

            /* Go through half of the items in third dimension and flip them
               with the other half */
            for(std::size_t i2 = 0, i2Max = size[2]/2; i2 != i2Max; ++i2) {
                char* const ptr2Left = ptr1 + i2*stride[2];
                char* const ptr2Right = ptr1 + (size[2] - i2 - 1)*stride[2];

                /* Copy 256-bit blocks at a time, which could hopefully make
                   use of 256-bit SIMD */
                constexpr std::size_t BlockSize = 32;
                alignas(BlockSize) char tmp[BlockSize];
                char* ptr3Left = ptr2Left;
                char* ptr3Right = ptr2Right;
                for(std::size_t i3 = 0, i3Max = size[3]/BlockSize; i3 != i3Max; ++i3) {
                    std::memcpy(tmp, ptr3Left, BlockSize);
                    std::memcpy(ptr3Left, ptr3Right, BlockSize);
                    std::memcpy(ptr3Right, tmp, BlockSize);

                    ptr3Left += BlockSize;
                    ptr3Right += BlockSize;
                }

                /* Copy the rest. I doubt an if() around this makes sense,
                   since it would slow down the very common and very slow case
                   where we're flipping pieces of data smaller than 256 bits */
                const std::size_t remainingSize = size[3]%BlockSize;
                std::memcpy(tmp, ptr3Left, remainingSize);
                std::memcpy(ptr3Left, ptr3Right, remainingSize);
                std::memcpy(ptr3Right, tmp, remainingSize);
            }
        }
    }
}